

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

nng_err http_set_header(nng_http *conn,char *key,char *val)

{
  int iVar1;
  char *pcVar2;
  undefined8 *item;
  nng_http_req *local_48;
  char *news;
  http_header *h;
  nni_http_entity *data;
  char *val_local;
  char *key_local;
  nng_http *conn_local;
  
  if ((conn->client & 1U) == 0) {
    local_48 = (nng_http_req *)&conn->res;
  }
  else {
    local_48 = &conn->req;
  }
  news = (char *)nni_list_first(&(local_48->data).hdrs);
  while( true ) {
    if (news == (char *)0x0) {
      item = (undefined8 *)nni_zalloc(0x28);
      if (item == (undefined8 *)0x0) {
        conn_local._4_4_ = NNG_ENOMEM;
      }
      else {
        *(byte *)(item + 4) = *(byte *)(item + 4) & 0xfb | 4;
        pcVar2 = nni_strdup(key);
        *item = pcVar2;
        if (pcVar2 == (char *)0x0) {
          nni_free(item,0x28);
          conn_local._4_4_ = NNG_ENOMEM;
        }
        else {
          pcVar2 = nni_strdup(val);
          item[1] = pcVar2;
          if (pcVar2 == (char *)0x0) {
            nni_strfree((char *)*item);
            nni_free(item,0x28);
            conn_local._4_4_ = NNG_ENOMEM;
          }
          else {
            nni_list_append(&(local_48->data).hdrs,item);
            conn_local._4_4_ = NNG_OK;
          }
        }
      }
      return conn_local._4_4_;
    }
    iVar1 = nni_strcasecmp(key,*(char **)news);
    if (iVar1 == 0) break;
    news = (char *)nni_list_next(&(local_48->data).hdrs,news);
  }
  pcVar2 = nni_strdup(val);
  if (pcVar2 == (char *)0x0) {
    return NNG_ENOMEM;
  }
  if (((byte)news[0x20] >> 1 & 1) == 0) {
    nni_strfree(*(char **)(news + 8));
    news[8] = '\0';
    news[9] = '\0';
    news[10] = '\0';
    news[0xb] = '\0';
    news[0xc] = '\0';
    news[0xd] = '\0';
    news[0xe] = '\0';
    news[0xf] = '\0';
  }
  *(char **)(news + 8) = pcVar2;
  return NNG_OK;
}

Assistant:

static nng_err
http_set_header(nng_http *conn, const char *key, const char *val)
{
	nni_http_entity *data =
	    conn->client ? &conn->req.data : &conn->res.data;
	http_header *h;

	NNI_LIST_FOREACH (&data->hdrs, h) {
		if (nni_strcasecmp(key, h->name) == 0) {
			char *news;
			if ((news = nni_strdup(val)) == NULL) {
				return (NNG_ENOMEM);
			}
			if (!h->static_value) {
				nni_strfree(h->value);
				h->value = NULL;
			}
			h->value = news;
			return (NNG_OK);
		}
	}

	if ((h = NNI_ALLOC_STRUCT(h)) == NULL) {
		return (NNG_ENOMEM);
	}
	h->alloc_header = true;
	if ((h->name = nni_strdup(key)) == NULL) {
		NNI_FREE_STRUCT(h);
		return (NNG_ENOMEM);
	}
	if ((h->value = nni_strdup(val)) == NULL) {
		nni_strfree(h->name);
		NNI_FREE_STRUCT(h);
		return (NNG_ENOMEM);
	}
	nni_list_append(&data->hdrs, h);
	return (NNG_OK);
}